

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O3

Program __thiscall
soul::Compiler::build(Compiler *this,CompileMessageList *messageList,BuildBundle *bundle)

{
  byte bVar1;
  pointer pSVar2;
  bool bVar3;
  UnicodeChar UVar4;
  RefCountedPtr<soul::Program::ProgramImpl> extraout_RDX;
  long lVar5;
  pointer pSVar6;
  long in_FS_OFFSET;
  Program PVar7;
  UTF8Reader t;
  CompileMessageHandler handler;
  Compiler c;
  ArrayWithPreallocation<soul::CodeLocation,_4UL> heartFiles;
  UTF8Reader local_1f8;
  BuildSettings *local_1f0;
  pointer local_1e8;
  CodeLocation local_1e0;
  _Any_data local_1d0;
  code *local_1c0;
  code *local_1b8;
  undefined8 local_1b0;
  CodeLocation local_1a8;
  CodeLocation local_198;
  undefined1 local_188 [8];
  UTF8Reader UStack_180;
  pointer local_178;
  Pool *local_170;
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_168;
  undefined1 local_150 [16];
  vector<soul::SourceFile,_std::allocator<soul::SourceFile>_> local_140;
  Value VStack_128;
  undefined1 local_c0 [88];
  CompileMessage local_68;
  
  local_1f0 = &bundle->settings;
  sanityCheckBuildSettings(local_1f0,(uint32_t)messageList,(uint32_t)bundle);
  pSVar6 = (bundle->sourceFiles).
           super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1e8 = (bundle->sourceFiles).
              super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_c0._0_8_ = local_c0 + 0x18;
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 4;
  if (pSVar6 != local_1e8) {
    do {
      CodeLocation::createFromSourceFile((CodeLocation *)local_188,pSVar6);
      local_1f8.data = UStack_180.data;
      while (((byte)*local_1f8.data - 9 < 5 || (*local_1f8.data == 0x20))) {
        UTF8Reader::operator++(&local_1f8);
      }
      lVar5 = 0;
      local_1d0._M_unused._M_object = local_1f8.data;
      do {
        if (lVar5 == 5) {
          ArrayWithPreallocation<soul::CodeLocation,_4UL>::push_back
                    ((ArrayWithPreallocation<soul::CodeLocation,_4UL> *)local_c0,
                     (CodeLocation *)local_188);
          break;
        }
        bVar1 = "#SOUL"[lVar5];
        lVar5 = lVar5 + 1;
        UVar4 = UTF8Reader::getAndAdvance((UTF8Reader *)&local_1d0);
      } while (UVar4 == bVar1);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_188);
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != local_1e8);
    if (local_c0._8_8_ != 0) {
      if ((local_c0._8_8_ != 1) ||
         (0x40 < (ulong)((long)(bundle->sourceFiles).
                               super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(bundle->sourceFiles).
                              super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>
                              ._M_impl.super__Vector_impl_data._M_start))) {
        local_188 = (undefined1  [8])0x0;
        UStack_180.data = (char *)0x0;
        CompileMessageHelpers::createMessage<>
                  (&local_68,syntax,error,
                   "When compiling HEART code, only a single module must be provided");
        CodeLocation::throwError((CodeLocation *)local_188,&local_68);
      }
      local_1e0.sourceCode.object = ((Ptr *)local_c0._0_8_)->object;
      if (local_1e0.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_1e0.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_1e0.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_1e0.location.data = ((UTF8Reader *)(local_c0._0_8_ + 8))->data;
      local_1b8 = std::
                  _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
                  ::_M_invoke;
      local_1d0._8_8_ = 0;
      local_1c0 = std::
                  _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
                  ::_M_manager;
      local_1b0 = *(undefined8 *)(in_FS_OFFSET + -8);
      *(_Any_data **)(in_FS_OFFSET + -8) = &local_1d0;
      local_1d0._M_unused._M_object = messageList;
      heart::Parser::parse((Parser *)this,&local_1e0);
      local_188 = (undefined1  [8])0x0;
      UStack_180.data = UStack_180.data & 0xffffffff00000000;
      local_178 = (pointer)0x1400000;
      local_170 = (Pool *)0x1400000;
      local_168.
      super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0xffffffff;
      local_168.
      super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_150._0_8_ = local_150._0_8_ & 0xffffffffffffff00;
      VStack_128.value.stringDictionary = &VStack_128.dictionary.super_StringDictionary;
      local_140.super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_140.super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_140.super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      VStack_128.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      VStack_128.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      VStack_128.packedData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      VStack_128.dictionary.super_StringDictionary._vptr_StringDictionary =
           (_func_int **)&PTR__SimpleStringDictionary_002f5a68;
      VStack_128.value.type.content.object = (Object *)0x0;
      VStack_128.value.type.allocator = (Allocator *)0x0;
      VStack_128.value.data = (uint8_t *)0x0;
      VStack_128.dictionary.strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      VStack_128.dictionary.strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      VStack_128.dictionary.strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      VStack_128.dictionary.strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      VStack_128._49_8_ = 0;
      local_168.
      super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_150;
      heart::Checker::sanityCheck((Program *)this,(BuildSettings *)local_188);
      choc::value::Value::~Value(&VStack_128);
      std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>::~vector(&local_140);
      if (local_168.
          super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)local_150) {
        operator_delete(local_168.
                        super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,local_150._0_8_ + 1);
      }
      CompileMessageHandler::~CompileMessageHandler((CompileMessageHandler *)&local_1d0);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1e0.sourceCode.object);
      goto LAB_001c4ad4;
    }
  }
  Compiler((Compiler *)local_188,
           (bundle->settings).overrideStandardLibrary.
           super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (bundle->settings).overrideStandardLibrary.
           super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
           super__Vector_impl_data._M_finish);
  pSVar6 = (bundle->settings).overrideStandardLibrary.
           super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (bundle->settings).overrideStandardLibrary.
           super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar6 != pSVar2) {
    do {
      CodeLocation::createFromSourceFile(&local_198,pSVar6);
      bVar3 = addCode((Compiler *)local_188,messageList,&local_198);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_198.sourceCode.object);
      if (!bVar3) {
        Program::Program((Program *)this);
        goto LAB_001c4aa2;
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != pSVar2);
  }
  pSVar6 = (bundle->sourceFiles).
           super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (bundle->sourceFiles).
           super__Vector_base<soul::SourceFile,_std::allocator<soul::SourceFile>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar6 != pSVar2) {
    do {
      CodeLocation::createFromSourceFile(&local_1a8,pSVar6);
      bVar3 = addCode((Compiler *)local_188,messageList,&local_1a8);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1a8.sourceCode.object);
      if (!bVar3) {
        Program::Program((Program *)this);
        goto LAB_001c4aa2;
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != pSVar2);
  }
  link(this,local_188,(char *)messageList);
LAB_001c4aa2:
  local_150._0_8_ = &PTR__StringDictionary_002f5170;
  std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::~vector
            ((vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_> *)
             (local_150 + 8));
  std::
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_168);
  std::
  vector<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
  ::~vector((vector<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
             *)local_188);
LAB_001c4ad4:
  ArrayWithPreallocation<soul::CodeLocation,_4UL>::clear
            ((ArrayWithPreallocation<soul::CodeLocation,_4UL> *)local_c0);
  PVar7.refHolder.object = extraout_RDX.object;
  PVar7.pimpl = (ProgramImpl *)this;
  return PVar7;
}

Assistant:

Program Compiler::build (CompileMessageList& messageList, const BuildBundle& bundle)
{
    sanityCheckBuildSettings (bundle.settings);

    auto heartFiles = getHEARTFiles (bundle);

    if (! heartFiles.empty())
    {
        if (heartFiles.size() > 1 || heartFiles.size() < bundle.sourceFiles.size())
            CodeLocation().throwError (Errors::onlyOneHeartFileAllowed());

        return buildHEART (messageList, heartFiles.front());
    }

    Compiler c (bundle.settings.overrideStandardLibrary.empty());

    if (! bundle.settings.overrideStandardLibrary.empty())
        for (auto& file : bundle.settings.overrideStandardLibrary)
            if (! c.addCode (messageList, CodeLocation::createFromSourceFile (file)))
                return {};

    for (auto& file : bundle.sourceFiles)
        if (! c.addCode (messageList, CodeLocation::createFromSourceFile (file)))
            return {};

    return c.link (messageList, bundle.settings);
}